

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O3

void __thiscall
opengv::absolute_pose::modules::Epnp::find_betas_approx_3
          (Epnp *this,Matrix<double,_6,_10,_0,_6,_10> *L_6x10,Matrix<double,_6,_1,_0,_6,_1> *Rho,
          double *betas)

{
  double *pdVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  Index index;
  void *pvVar6;
  undefined8 *puVar7;
  long lVar8;
  SrcEvaluatorType srcEvaluator;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  undefined1 auVar14 [16];
  VectorXd b5;
  MatrixXd L_6x5;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVD;
  assign_op<double,_double> local_289;
  DenseStorage<double,__1,__1,_1,_0> local_288;
  Matrix<double,__1,_1,_0,__1,_1> local_278;
  DenseStorage<double,__1,__1,__1,_0> local_268;
  SrcXprType local_248;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> local_238;
  
  local_268.m_data = (double *)0x0;
  local_268.m_rows = 0;
  local_268.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_268,0x1e,6,5);
  lVar8 = 0;
  do {
    pdVar1 = local_268.m_data + lVar8;
    *pdVar1 = (L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.
              m_data.array[lVar8];
    pdVar1[local_268.m_rows] =
         (L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.
         array[lVar8 + 6];
    pdVar1[local_268.m_rows * 2] =
         (L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.
         array[lVar8 + 0xc];
    pdVar1[local_268.m_rows * 3] =
         (L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.
         array[lVar8 + 0x12];
    lVar5 = lVar8 + 0x18;
    lVar8 = lVar8 + 1;
    pdVar1[local_268.m_rows * 4] =
         (L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.m_data.
         array[lVar5];
  } while (lVar8 != 6);
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            (&local_238,(MatrixType *)&local_268,0x14);
  pvVar6 = malloc(0x70);
  if (pvVar6 == (void *)0x0) {
    puVar7 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar7 = srand;
    __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  *(void **)(((ulong)pvVar6 & 0xffffffffffffffc0) + 0x38) = pvVar6;
  local_278.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)(((ulong)pvVar6 & 0xffffffffffffffc0) + 0x40);
  lVar8 = 0;
  local_278.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 6;
  do {
    local_278.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[lVar8]
         = (Rho->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.
           array[lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 6);
  local_248.m_rhs = &local_278;
  local_288 = (DenseStorage<double,__1,__1,_1,_0>)(ZEXT816(0) << 0x20);
  local_248.m_dec =
       &local_238.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_288,
             local_238.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
             .m_cols,1);
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Solve<Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run((Matrix<double,__1,_1,_0,__1,_1> *)&local_288,&local_248,&local_289);
  dVar13 = *local_288.m_data;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar13;
  if (0.0 <= dVar13) {
    if (dVar13 < 0.0) {
      dVar13 = sqrt(dVar13);
    }
    else {
      auVar10 = vsqrtsd_avx(auVar10,auVar10);
      dVar13 = auVar10._0_8_;
    }
    *betas = dVar13;
    dVar13 = 0.0;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = local_288.m_data[2];
    if (local_288.m_data[2] <= 0.0) goto LAB_00178983;
  }
  else {
    auVar14._0_8_ = -dVar13;
    auVar14._8_8_ = 0x8000000000000000;
    if (-0.0 < dVar13) {
      dVar13 = sqrt(auVar14._0_8_);
    }
    else {
      auVar10 = vsqrtsd_avx(auVar14,auVar14);
      dVar13 = auVar10._0_8_;
    }
    *betas = dVar13;
    dVar13 = 0.0;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = local_288.m_data[2];
    if (0.0 <= local_288.m_data[2]) goto LAB_00178983;
    auVar3._8_8_ = 0x8000000000000000;
    auVar3._0_8_ = 0x8000000000000000;
    auVar9 = vxorpd_avx512vl(auVar11,auVar3);
  }
  if (auVar9._0_8_ < 0.0) {
    dVar13 = sqrt(auVar9._0_8_);
  }
  else {
    auVar10 = vsqrtsd_avx(auVar9,auVar9);
    dVar13 = auVar10._0_8_;
  }
LAB_00178983:
  betas[1] = dVar13;
  dVar13 = *betas;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar13;
  if (local_288.m_data[1] < 0.0) {
    auVar4._8_8_ = 0x8000000000000000;
    auVar4._0_8_ = 0x8000000000000000;
    auVar10 = vxorpd_avx512vl(auVar12,auVar4);
    dVar13 = auVar10._0_8_;
    dVar2 = (double)vmovlpd_avx(auVar10);
    *betas = dVar2;
  }
  betas[2] = local_288.m_data[3] / dVar13;
  betas[3] = 0.0;
  free((void *)local_288.m_data[-1]);
  if (local_278.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
      (double *)0x0) {
    free((void *)local_278.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data[-1]);
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD(&local_238);
  if (local_268.m_data != (double *)0x0) {
    free((void *)local_268.m_data[-1]);
  }
  return;
}

Assistant:

void
opengv::absolute_pose::modules::Epnp::find_betas_approx_3(
    const Eigen::Matrix<double,6,10> & L_6x10,
    const Eigen::Matrix<double,6,1> & Rho,
    double * betas)
{
  Eigen::MatrixXd L_6x5(6,5);

  for(int i = 0; i < 6; i++)
  {
    L_6x5(i,0) = L_6x10(i,0);
    L_6x5(i,1) = L_6x10(i,1);
    L_6x5(i,2) = L_6x10(i,2);
    L_6x5(i,3) = L_6x10(i,3);
    L_6x5(i,4) = L_6x10(i,4);
  }

  Eigen::JacobiSVD<Eigen::MatrixXd> SVD(
      L_6x5,
      Eigen::ComputeFullV | Eigen::ComputeFullU);
  Eigen::VectorXd Rho_temp = Rho;
  Eigen::VectorXd b5 = SVD.solve(Rho_temp);

  if (b5[0] < 0)
  {
    betas[0] = sqrt(-b5[0]);
    betas[1] = (b5[2] < 0) ? sqrt(-b5[2]) : 0.0;
  }
  else
  {
    betas[0] = sqrt(b5[0]);
    betas[1] = (b5[2] > 0) ? sqrt(b5[2]) : 0.0;
  }
  if (b5[1] < 0) betas[0] = -betas[0];
  betas[2] = b5[3] / betas[0];
  betas[3] = 0.0;
}